

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O3

char * google::protobuf::internal::UTF8CoerceToStructurallyValid
                 (StringPiece *src_str,char *idst,char replace_char)

{
  char *str;
  long lVar1;
  char *pcVar2;
  int str_length;
  size_t sVar3;
  char *pcVar4;
  int bytes_consumed;
  int local_44;
  char *local_40;
  int local_34;
  
  str = src_str->ptr_;
  local_34 = 0;
  str_length = (int)src_str->length_;
  UTF8GenericScanFastAscii((UTF8ScanObj *)utf8acceptnonsurrogates_obj,str,str_length,&local_34);
  sVar3 = (size_t)local_34;
  local_40 = str;
  if (local_34 != str_length) {
    memmove(idst,str,sVar3);
    local_40 = idst;
    if ((long)sVar3 < (long)str_length) {
      pcVar2 = str + sVar3;
      pcVar4 = idst + sVar3;
      do {
        *pcVar4 = replace_char;
        pcVar2 = pcVar2 + 1;
        lVar1 = (long)(str + str_length) - (long)pcVar2;
        if (lVar1 < 0) {
          __assert_fail("len >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                        ,0xe4,
                        "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                       );
        }
        local_44 = 0;
        UTF8GenericScanFastAscii
                  ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,pcVar2,(int)lVar1,&local_44);
        sVar3 = (size_t)local_44;
        memmove(pcVar4 + 1,pcVar2,sVar3);
        pcVar2 = pcVar2 + sVar3;
        pcVar4 = pcVar4 + sVar3 + 1;
      } while (pcVar2 < str + str_length);
    }
  }
  return local_40;
}

Assistant:

char* UTF8CoerceToStructurallyValid(const StringPiece& src_str,
                                    char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}